

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regalloc.cpp
# Opt level: O3

void __thiscall asmjit::RAPass::RAPass(RAPass *this)

{
  CBPass::CBPass(&this->super_CBPass,"RA");
  (this->super_CBPass)._vptr_CBPass = (_func_int **)&PTR__RAPass_001c6cd0;
  (this->_heap)._zone = (Zone *)0x0;
  (this->_heap)._slots[0] = (Slot *)0x0;
  (this->_heap)._slots[1] = (Slot *)0x0;
  (this->_heap)._slots[2] = (Slot *)0x0;
  (this->_heap)._slots[3] = (Slot *)0x0;
  (this->_heap)._slots[4] = (Slot *)0x0;
  (this->_heap)._slots[5] = (Slot *)0x0;
  (this->_heap)._slots[6] = (Slot *)0x0;
  (this->_heap)._slots[3] = (Slot *)0x0;
  (this->_heap)._slots[4] = (Slot *)0x0;
  (this->_heap)._slots[5] = (Slot *)0x0;
  (this->_heap)._slots[6] = (Slot *)0x0;
  (this->_heap)._slots[7] = (Slot *)0x0;
  (this->_heap)._slots[8] = (Slot *)0x0;
  (this->_heap)._slots[9] = (Slot *)0x0;
  (this->_heap)._dynamicBlocks = (DynamicBlock *)0x0;
  this->_varMapToVaListOffset = 0;
  (this->_unreachableList)._first = (Link *)0x0;
  (this->_unreachableList)._last = (Link *)0x0;
  (this->_returningList)._first = (Link *)0x0;
  (this->_returningList)._last = (Link *)0x0;
  (this->_jccList)._first = (Link *)0x0;
  (this->_jccList)._last = (Link *)0x0;
  (this->_contextVd).super_ZoneVectorBase._data = (void *)0x0;
  (this->_contextVd).super_ZoneVectorBase._length = 0;
  (this->_contextVd).super_ZoneVectorBase._capacity = 0;
  return;
}

Assistant:

RAPass::RAPass() noexcept :
  CBPass("RA"),
  _varMapToVaListOffset(0) {}